

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O3

uintmax_t __thiscall
pstack::Procman::ExpressionStack::eval
          (ExpressionStack *this,Process *proc,Attribute *attr,StackFrame *frame,Addr reloc)

{
  ostream *this_00;
  int iVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Reader *pRVar3;
  string *psVar4;
  string lle;
  undefined1 auVar5 [8];
  element_type *peVar6;
  ulong uVar7;
  long *plVar8;
  uintmax_t uVar9;
  long lVar10;
  intmax_t iVar11;
  intmax_t iVar12;
  uintmax_t uVar13;
  Exception *pEVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  Addr AVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 local_2e0 [8];
  Attribute unitLow;
  DIE local_2b0;
  undefined1 local_288 [16];
  Reader *local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  uint local_268;
  undefined8 local_e8;
  undefined8 local_e0;
  Reader *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  Reader *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  Reader *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a8;
  undefined1 local_a0 [8];
  ProcessLocation loc;
  unsigned_long local_70;
  uint64_t base;
  ExpressionStack *local_60;
  DWARFReader local_58;
  
  lVar2 = *(long *)(attr + 0x18);
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(attr + 0x20);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  lVar10 = *(long *)(lVar2 + 200);
  loc.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reloc;
  local_60 = this;
  StackFrame::scopeIP((ProcessLocation *)local_a0,frame,proc);
  auVar5 = local_a0;
  pstack::Dwarf::Unit::root();
  pstack::Dwarf::DIE::attribute((AttrName)local_2e0,SUB81(&local_2b0,0));
  uVar7 = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_2e0);
  local_70 = (long)&(loc.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar7;
  iVar1 = **(int **)(attr + 0x28);
  if (1 < iVar1 - 9U) {
    if (iVar1 == 0x17) {
      psVar4 = *(string **)(lVar10 + 0x10);
      base = (uint64_t)frame;
      if (4 < *(ushort *)(lVar2 + 0xf0)) {
        local_288._0_8_ = &local_278;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,".debug_loclists","");
        local_e0 = pstack::Elf::Object::getDebugSection(psVar4,(uint)local_288);
        if ((Reader **)local_288._0_8_ != &local_278) {
          operator_delete((void *)local_288._0_8_,(ulong)(local_278 + 1));
        }
        psVar4 = *(string **)(lVar10 + 0x10);
        local_288._0_8_ = &local_278;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,".debug_addr","");
        local_e8 = pstack::Elf::Object::getDebugSection(psVar4,(uint)local_288);
        if ((Reader *)local_288._0_8_ != (Reader *)&local_278) {
          operator_delete((void *)local_288._0_8_,(ulong)(local_278 + 1));
        }
        pstack::Elf::Section::io();
        local_58.off = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
        local_58.end = (**(code **)(*(long *)local_b0 + 0x40))();
        local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_b0;
        local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = p_Stack_a8;
        local_b0 = (Reader *)0x0;
        p_Stack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58.addrLen = 8;
LAB_0012e8c6:
        Reader::readObj<unsigned_char>
                  (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_58.off,local_288,1);
        local_58.off = local_58.off + 1;
        lle = local_288[0];
        switch(local_288._0_8_ & 0xff) {
        case 0:
          goto switchD_0012e8fa_caseD_0;
        case 1:
          auVar17 = (**(code **)(*(long *)local_58.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))();
          local_58.off = local_58.off + auVar17._8_8_;
          pstack::Elf::Section::io();
          Reader::readObj<unsigned_long>
                    ((Reader *)local_288._0_8_,auVar17._0_8_ * (ulong)*(byte *)(lVar2 + 0x100),
                     &local_70,1);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
          }
          goto LAB_0012e8c6;
        default:
          pEVar14 = (Exception *)__cxa_allocate_exception(0x1a0);
          memset((Exception *)local_288,0,0x1a0);
          Exception::Exception((Exception *)local_288);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_288 + 8),"unhandled DW_LLE_",0x11);
          Procman::operator<<((ostream *)(local_288 + 8),(DW_LLE)lle);
          Exception::Exception(pEVar14,(Exception *)local_288);
          __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
        case 4:
          auVar17 = (**(code **)(*(long *)local_58.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))();
          local_58.off = local_58.off + auVar17._8_8_;
          auVar18 = (**(code **)(*(long *)local_58.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_58.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_58.off);
          local_58.off = local_58.off + auVar18._8_8_;
          auVar19 = (**(code **)(*(long *)local_58.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_58.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_58.off);
          _Var15._M_pi = local_58.io.
                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          peVar6 = local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar10 = auVar19._0_8_;
          local_58.off = local_58.off + auVar19._8_8_;
          if (((ulong)auVar5 < auVar17._0_8_ + local_70) ||
             (local_70 + auVar18._0_8_ <= (ulong)auVar5)) {
LAB_0012ea16:
            local_58.off = local_58.off + lVar10;
            goto LAB_0012e8c6;
          }
          if (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_288._8_8_ = local_58.off + lVar10;
          local_288._0_8_ = local_58.off;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
            local_288._8_8_ =
                 (**(code **)(*(long *)local_58.io.
                                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 0x40))
                           (local_58.io.
                            super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
          }
          local_278 = peVar6;
          _Stack_270._M_pi = _Var15._M_pi;
          local_268 = 8;
          if (loc.location_ == 0) {
            AVar16 = 0;
          }
          else {
            AVar16 = (long)local_a0 - *(long *)loc.location_;
          }
          uVar9 = eval(local_60,proc,(DWARFReader *)local_288,(StackFrame *)base,AVar16);
          break;
        case 6:
          goto switchD_0012e8fa_caseD_6;
        case 8:
          uVar9 = Dwarf::DWARFReader::getuint(&local_58,(ulong)*(byte *)(lVar2 + 0x100));
          auVar17 = (**(code **)(*(long *)local_58.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_58.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_58.off);
          local_58.off = local_58.off + auVar17._8_8_;
          auVar18 = (**(code **)(*(long *)local_58.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_58.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_58.off);
          _Var15._M_pi = local_58.io.
                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          peVar6 = local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar10 = auVar18._0_8_;
          local_58.off = local_58.off + auVar18._8_8_;
          if (uVar9 + local_70 + auVar17._0_8_ <= (ulong)auVar5 || (ulong)auVar5 < uVar9 + local_70)
          goto LAB_0012ea16;
          if (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_288._8_8_ = local_58.off + lVar10;
          local_288._0_8_ = local_58.off;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
            local_288._8_8_ =
                 (**(code **)(*(long *)local_58.io.
                                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 0x40))
                           (local_58.io.
                            super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
          }
          local_278 = peVar6;
          _Stack_270._M_pi = _Var15._M_pi;
          local_268 = 8;
          if (loc.location_ == 0) {
            AVar16 = 0;
          }
          else {
            AVar16 = (long)local_a0 - *(long *)loc.location_;
          }
          uVar9 = eval(local_60,proc,(DWARFReader *)local_288,(StackFrame *)base,AVar16);
        }
        _Var15._M_pi = local_58.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
          _Var15._M_pi = local_58.io.
                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
        }
        goto LAB_0012e72e;
      }
      local_288._0_8_ = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_288,".debug_loc","");
      pstack::Elf::Object::getDebugSection(psVar4,(uint)local_288);
      if ((Reader **)local_288._0_8_ != &local_278) {
        operator_delete((void *)local_288._0_8_,(ulong)(local_278 + 1));
      }
      pstack::Elf::Section::io();
      local_288._0_8_ = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
      local_288._8_8_ = (**(code **)(*(long *)local_d8 + 0x40))();
      local_278 = local_d8;
      _Stack_270._M_pi = p_Stack_d0;
      local_d8 = (Reader *)0x0;
      p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_268 = 8;
      uVar9 = 0;
      while( true ) {
        iVar11 = Dwarf::DWARFReader::getint((DWARFReader *)local_288,8);
        iVar12 = Dwarf::DWARFReader::getint((DWARFReader *)local_288,8);
        _Var15._M_pi = _Stack_270._M_pi;
        if (iVar12 == 0 && iVar11 == 0) break;
        uVar13 = Dwarf::DWARFReader::getuint((DWARFReader *)local_288,2);
        _Var15._M_pi = _Stack_270._M_pi;
        pRVar3 = local_278;
        if ((ulong)auVar5 < iVar12 + local_70 && iVar11 + local_70 <= (ulong)auVar5) {
          if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_270._M_pi)->_M_use_count = (_Stack_270._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_270._M_pi)->_M_use_count = (_Stack_270._M_pi)->_M_use_count + 1;
            }
          }
          local_58.end = local_288._0_8_ + (uVar13 & 0xffffffff);
          local_58.off = local_288._0_8_;
          if ((Reader *)local_58.end == (Reader *)0xffffffffffffffff) {
            local_58.end = (**(code **)(*(long *)local_278 + 0x40))(local_278);
          }
          local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pRVar3;
          local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Var15._M_pi;
          local_58.addrLen = 8;
          if (loc.location_ == 0) {
            AVar16 = 0;
          }
          else {
            AVar16 = (long)local_a0 - *(long *)loc.location_;
          }
          uVar9 = eval(local_60,proc,&local_58,(StackFrame *)base,AVar16);
          _Var15._M_pi = _Stack_270._M_pi;
          if (local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.io.
                       super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var15._M_pi = _Stack_270._M_pi;
          }
          break;
        }
        local_288._0_8_ = local_288._0_8_ + uVar13;
      }
      goto LAB_0012e72e;
    }
    if (iVar1 != 0x18) {
      pEVar14 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset((Exception *)local_288,0,0x1a0);
      Exception::Exception((Exception *)local_288);
      this_00 = (ostream *)(local_288 + 8);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"unhandled attribute form ",0x19);
      std::ostream::operator<<(this_00,**(int **)(attr + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>(this_00," evaluating expression",0x16);
      Exception::Exception(pEVar14,(Exception *)local_288);
      __cxa_throw(pEVar14,&Exception::typeinfo,Exception::~Exception);
    }
  }
  plVar8 = (long *)pstack::Dwarf::DIE::Attribute::value();
  pRVar3 = *(Reader **)*plVar8;
  uVar7 = ((ulong *)*plVar8)[1];
  pstack::Elf::Section::io();
  local_288._8_8_ = pRVar3 + uVar7;
  local_288._0_8_ = pRVar3;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
    local_288._8_8_ = (**(code **)(*(long *)local_c8 + 0x40))();
  }
  local_278 = local_c8;
  _Stack_270._M_pi = p_Stack_c0;
  local_c8 = (Reader *)0x0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268 = 8;
  uVar9 = eval(local_60,proc,(DWARFReader *)local_288,frame,
               (Addr)loc.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  _Var15._M_pi = _Stack_270._M_pi;
LAB_0012e72e:
  if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
  }
  Dwarf::DIE::~DIE((DIE *)local_2e0);
  Dwarf::DIE::~DIE(&local_2b0);
  if (loc.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               loc.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return uVar9;
switchD_0012e8fa_caseD_6:
  uVar9 = Dwarf::DWARFReader::getuint(&local_58,(ulong)*(byte *)(lVar2 + 0x100));
  local_70 = (long)&(loc.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar9;
  goto LAB_0012e8c6;
switchD_0012e8fa_caseD_0:
  uVar9 = 0;
  _Var15._M_pi = local_58.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  goto LAB_0012e72e;
}

Assistant:

uintmax_t
ExpressionStack::eval(Process &proc, const Dwarf::DIE::Attribute &attr,
                      const StackFrame *frame, Elf::Addr reloc)
{
    Dwarf::Unit::sptr unit = attr.die.getUnit();
    const Dwarf::Info *dwarf = unit->dwarf;
    auto loc = frame->scopeIP(proc);
    auto ip = loc.location();

    const auto &unitEntry = unit->root();
    auto unitLow = unitEntry.attribute(Dwarf::DW_AT_low_pc);

    // default base address is relocation of the object + base of unit.
    uint64_t base = reloc + uintmax_t(unitLow);

    switch (attr.form()) {
        case Dwarf::DW_FORM_sec_offset:
            if (unit->version >= 5) {
                // For dwarf 5, this will be a debug_loclists entry.
                const Elf::Section &sec = dwarf->elf->getDebugSection(".debug_loclists", SHT_NULL);
                const Elf::Section &addrsec = dwarf->elf->getDebugSection(".debug_addr", SHT_NULL);
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    auto lle = DW_LLE(r.getu8());
                    switch (lle) {
                        case DW_LLE_end_of_list:
                            return 0; // failed to find a loclist for the given IP.

                        case DW_LLE_offset_pair:
                        {
                            auto start = r.getuleb128();
                            auto end = r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }

                        case DW_LLE_base_address:
                            base = reloc + r.getuint(unit->addrlen);
                            break;

                        case DW_LLE_base_addressx:
                            {
                            auto idx = r.getuleb128();
                            addrsec.io()->readObj(idx * unit->addrlen, &base);
                            }
                            break;

                        case DW_LLE_start_length: {
                            auto start = r.getuint(unit->addrlen);
                            auto end = start + r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }
                        default:
                            throw (Exception() << "unhandled DW_LLE_" << lle);
                    }
                }
            } else {
                // For dwarf 4, this will be a debug_loc entry.
                auto &sec = dwarf->elf->getDebugSection(".debug_loc", SHT_NULL);

                // convert this object-relative addr to a unit-relative one
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    Elf::Addr start = r.getint(sizeof start);
                    Elf::Addr end = r.getint(sizeof end);
                    if (start == 0 && end == 0)
                        return 0;
                    auto len = r.getuint(2);
                    if (ip >= base + start && ip < base + end) {
                        Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + Elf::Word(len));
                        return eval(proc, exr, frame, loc.elfReloc());
                    }
                    r.skip(len);
                }
            }
            throw (Exception() << ".debug_loc search failed");

        case Dwarf::DW_FORM_block1:
        case Dwarf::DW_FORM_block:
        case Dwarf::DW_FORM_exprloc: {
            const auto &block = Dwarf::Block(attr);
            Dwarf::DWARFReader r(dwarf->debugInfo.io(), block.offset, block.offset + block.length);
            return eval(proc, r, frame, reloc);
        }
        default:
            throw (Exception() << "unhandled attribute form " << attr.form() << " evaluating expression");
    }
}